

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int Armor_on(void)

{
  obj *obj;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  
  if (uarm == (obj *)0x0) {
    return 0;
  }
  Oprops_on(uarm,1);
  obj = uarm;
  if ((((uarm == (obj *)0x0) || (0x15 < (ushort)(uarm->otyp - 0x54U))) ||
      (obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr == (char *)0x0)) ||
     (iVar2 = strncmp(obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr,"gold ",5),
     iVar2 != 0)) goto LAB_0018522a;
  begin_burn(level,obj,'\0');
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001851e4;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001851df;
  }
  else {
LAB_001851df:
    if (ublindf == (obj *)0x0) goto LAB_0018522a;
LAB_001851e4:
    if (ublindf->oartifact != '\x1d') goto LAB_0018522a;
  }
  pcVar3 = Tobjnam(uarm,"begin");
  pline("%s to glow.",pcVar3);
LAB_0018522a:
  if ((uarm->otyp == 0x69) || (uarm->otyp == 0x5e)) {
    u.uprops[1].extrinsic._0_1_ = (byte)u.uprops[1].extrinsic | 1;
    u.uprops[2].extrinsic._0_1_ = (byte)u.uprops[2].extrinsic | 1;
    u.uprops[3].extrinsic._0_1_ = (byte)u.uprops[3].extrinsic | 1;
    u.uprops[4].extrinsic._0_1_ = (byte)u.uprops[4].extrinsic | 1;
    u.uprops[5].extrinsic._0_1_ = (byte)u.uprops[5].extrinsic | 1;
    u.uprops[6].extrinsic._0_1_ = (byte)u.uprops[6].extrinsic | 1;
    u.uprops[7].extrinsic._0_1_ = (byte)u.uprops[7].extrinsic | 1;
    u.uprops[8].extrinsic._0_1_ = (byte)u.uprops[8].extrinsic | 1;
    u.uprops[0x2a].extrinsic._0_1_ = (byte)u.uprops[0x2a].extrinsic | 1;
  }
  bVar1 = is_racial_armor(uarm,&youmonst);
  if (bVar1 == '\0') {
    u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
  }
  if (1 < moves) {
    discover_cursed_equip(uarm);
    encumber_msg();
  }
  return 0;
}

Assistant:

static int Armor_on(void)
{
    if (!uarm) return 0;

    Oprops_on(uarm, W_ARM);

    if (uarm && Is_gold_dragon_armor(uarm->otyp)) {
	begin_burn(level, uarm, FALSE);
	if (!Blind)
	    pline("%s to glow.", Tobjnam(uarm, "begin"));
    }

    switch (uarm->otyp) {
	case CHROMATIC_DRAGON_SCALES:
	case CHROMATIC_DRAGON_SCALE_MAIL:
	    EFire_resistance	|= W_ARM;
	    ECold_resistance	|= W_ARM;
	    ESleep_resistance	|= W_ARM;
	    EDisint_resistance	|= W_ARM;
	    EShock_resistance	|= W_ARM;
	    EPoison_resistance	|= W_ARM;
	    EAcid_resistance	|= W_ARM;
	    EStone_resistance	|= W_ARM;
	    EReflecting		|= W_ARM;
	    break;
	default:
	    break;
    }

    if (uarm && !is_racial_armor(uarm, &youmonst))
	u.uconduct.unracearmor++;

    /* suppress messages if called on first game turn via set_wear() */
    if (moves > 1) {
	discover_cursed_equip(uarm);
	encumber_msg();
    }

    return 0;
}